

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::TSPI_PDU::Decode(TSPI_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pcVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  KUINT8 i;
  byte bVar4;
  allocator<char> local_49;
  KOCTET tmp;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x18 < iVar3 + (uint)KVar2) {
    pcVar1 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar1) {
      (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar1;
    }
    LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&(this->m_TSPIFlagUnion).m_ui8Flag);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    if ((bVar4 & 1) != 0) {
      (*(this->m_LinVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_LinVel,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 2) != 0) {
      (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 4) != 0) {
      (*(this->m_PosErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_PosErr,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 8) != 0) {
      (*(this->m_OriErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_OriErr,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 0x10) != 0) {
      (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[3])
                (&this->m_DeadReckoningParameter,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 0x20) != 0) {
      (*(this->m_MeasureSpd).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MeasureSpd,stream);
      bVar4 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar4 & 0x40) != 0) {
      KDataStream::Read(stream,&this->m_ui8SSDLen);
      for (bVar4 = 0; bVar4 < this->m_ui8SSDLen; bVar4 = bVar4 + 1) {
        KDataStream::Read(stream,&tmp);
        std::vector<char,_std::allocator<char>_>::push_back(&this->m_vSSD,&tmp);
      }
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_49);
  KException::KException(this_00,(KString *)&tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void TSPI_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TSPI_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSSD.clear();

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_TSPIFlagUnion.m_ui8Flag
           >> KDIS_STREAM m_Loc;

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        stream >> KDIS_STREAM m_LinVel;
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        stream >> KDIS_STREAM m_Ori;
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        stream >> KDIS_STREAM m_PosErr;
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        stream >> KDIS_STREAM m_OriErr;
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        stream >> KDIS_STREAM m_DeadReckoningParameter;
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        stream >> KDIS_STREAM m_MeasureSpd;
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        stream >> m_ui8SSDLen;

        // Decode System Specific Data
        KOCTET tmp;
        for( KUINT8 i = 0; i < m_ui8SSDLen; ++i )
        {
            stream >> tmp;
            m_vSSD.push_back( tmp );
        }
    }
}